

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision_frontend.cpp
# Opt level: O0

void __thiscall
CollisionFrontend::print_broad_clash_counts
          (CollisionFrontend *this,Structure *Conf,vector<int,_std::allocator<int>_> *starts,
          vector<int,_std::allocator<int>_> *ends,bool b_ignore_self)

{
  double elem_center_y;
  double elem_center_z;
  uint uVar1;
  int res_ix_a;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  Residue *this_00;
  Atom *atom_00;
  atom_key *paVar6;
  reference pvVar7;
  Atom *atom_01;
  string *psVar8;
  ostream *poVar9;
  void *pvVar10;
  double elem_radius;
  double dVar11;
  Atom *nearby_atom;
  atom_key *nearby_atom_key;
  size_t i_nearby_atom;
  size_t num_nearby_atoms;
  undefined1 local_b8 [8];
  filter_results_t nearby_atoms;
  bool is_bb_atom;
  Atom *atom;
  int iStack_88;
  short i_atom;
  int memb_clashes;
  int sc_clashes;
  int bb_clashes;
  Residue *res;
  size_t i_res;
  size_t i_loop;
  int local_60;
  int total_memb_clashes;
  int total_sc_clashes;
  int total_bb_clashes;
  size_t num_loops;
  double ofac2;
  atom_info infos [2];
  bool b_ignore_self_local;
  vector<int,_std::allocator<int>_> *ends_local;
  vector<int,_std::allocator<int>_> *starts_local;
  Structure *Conf_local;
  CollisionFrontend *this_local;
  
  infos[1]._11_1_ = b_ignore_self;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(starts);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(ends);
  if (sVar3 != sVar4) {
    __assert_fail("starts.size() == ends.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                  ,0x1e5,
                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                 );
  }
  std::operator<<((ostream *)&std::cout,"res,bbc,scc,tot,mc\n");
  memset(&ofac2,0,0x18);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(starts);
  total_memb_clashes = 0;
  local_60 = 0;
  i_loop._4_4_ = 0;
  i_res = 0;
  do {
    if (sVar3 <= i_res) {
      poVar9 = std::operator<<((ostream *)&std::cout,"TOTAL BB CLASHES: ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,total_memb_clashes);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,"TOTAL SC CLASHES: ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,local_60);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,"TOTAL MEMB CLASHES: ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,i_loop._4_4_);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      return;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](starts,i_res);
    for (res = (Residue *)(long)*pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](ends,i_res),
        res <= (Residue *)(long)*pvVar5; res = (Residue *)((long)&res->_atom + 1)) {
      this_00 = Conf->_res + (long)res;
      if ((Residue *)(long)this_00->_posn != res) {
        __assert_fail("res._posn == i_res",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                      ,0x1fd,
                      "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                     );
      }
      memb_clashes = 0;
      iStack_88 = 0;
      atom._4_4_ = 0;
      for (atom._2_2_ = 0; atom._2_2_ < this_00->_numAtom; atom._2_2_ = atom._2_2_ + 1) {
        atom_00 = this_00->_atom + atom._2_2_;
        uVar1 = VdwUtils::should_ignore_atom(atom_00);
        if (uVar1 == 0) {
          nearby_atoms.
          super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = atom._2_2_ < 6;
          res_ix_a = (int)res;
          if ((bool)nearby_atoms.
                    super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_) {
            ofac2._0_4_ = res_ix_a;
            if (res_ix_a < 1) {
              __assert_fail("infos[e1_3_gobbo].res_ix >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x211,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            if (Conf->_numRes < res_ix_a) {
              __assert_fail("infos[e1_3_gobbo].res_ix <= Conf._numRes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x212,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            ofac2._4_4_ = (int)atom._2_2_;
            infos[0].res_ix._0_2_ = Conf->_res[res_ix_a]._type;
          }
          iVar2 = Membrane::collides(&this->m_membrane,atom_00,this->m_ofac2[2]);
          if (iVar2 != 0) {
            atom._4_4_ = atom._4_4_ + 1;
          }
          std::vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
          ::vector((vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                    *)local_b8);
          dVar11 = (atom_00->super_Point).x;
          elem_center_y = (atom_00->super_Point).y;
          elem_center_z = (atom_00->super_Point).z;
          elem_radius = collision_grid_prot::elem_radius(atom_00);
          collision_grid_prot::filter
                    (&this->m_broad_phase,(filter_results_t *)local_b8,dVar11,elem_center_y,
                     elem_center_z,elem_radius);
          paVar6 = (atom_key *)
                   std::
                   vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                   ::size((vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                           *)local_b8);
          for (nearby_atom_key = (atom_key *)0x0; nearby_atom_key < paVar6;
              nearby_atom_key = (atom_key *)((long)&nearby_atom_key->res_ix + 1)) {
            pvVar7 = std::
                     vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                     ::operator[]((vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                                   *)local_b8,(size_type)nearby_atom_key);
            if (pvVar7->res_ix == 0) {
              __assert_fail("nearby_atom_key.res_ix >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x226,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            if ((uint)Conf->_numRes < pvVar7->res_ix) {
              __assert_fail("nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x227,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            if ((uint)(int)Conf->_res[pvVar7->res_ix]._numAtom <= pvVar7->atom_ix) {
              __assert_fail("nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x229,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            atom_01 = Conf->_res[pvVar7->res_ix]._atom + pvVar7->atom_ix;
            uVar1 = VdwUtils::should_ignore_atom(atom_01);
            if (uVar1 != 0) {
              __assert_fail("!VdwUtils::should_ignore_atom(nearby_atom)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x22b,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            if (((infos[1]._11_1_ & 1) == 0) || ((Residue *)(ulong)pvVar7->res_ix != res)) {
              if ((nearby_atoms.
                   super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                infos[0].atom_ix = pvVar7->res_ix;
                infos[0]._8_4_ = pvVar7->atom_ix;
                infos[1].res_ix._0_2_ = Conf->_res[pvVar7->res_ix]._type;
                iVar2 = anon_unknown.dwarf_16f6b::gobbo_are_1_3_connected((atom_info *)&ofac2);
                if ((iVar2 != 0) ||
                   (iVar2 = anon_unknown.dwarf_16f6b::hack_ignore_Ca1_with_O_clash
                                      ((atom_info *)&ofac2), iVar2 != 0)) goto LAB_00157546;
              }
              dVar11 = get_ofac2(this,res_ix_a,pvVar7->res_ix);
              iVar2 = anon_unknown.dwarf_16f6b::atoms_overlap(atom_00,atom_01,dVar11);
              if (iVar2 != 0) {
                if ((nearby_atoms.
                     super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                  iStack_88 = iStack_88 + 1;
                }
                else {
                  memb_clashes = memb_clashes + 1;
                }
                break;
              }
            }
LAB_00157546:
          }
          std::vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
          ::~vector((vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                     *)local_b8);
        }
      }
      psVar8 = Residue::get_name_3_abi_cxx11_(this_00);
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)psVar8);
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ulong)res);
      poVar9 = std::operator<<(poVar9,",");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,memb_clashes);
      poVar9 = std::operator<<(poVar9,",");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iStack_88);
      poVar9 = std::operator<<(poVar9,",");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,memb_clashes + iStack_88);
      poVar9 = std::operator<<(poVar9,",");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,atom._4_4_);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      total_memb_clashes = memb_clashes + total_memb_clashes;
      local_60 = iStack_88 + local_60;
      i_loop._4_4_ = atom._4_4_ + i_loop._4_4_;
    }
    i_res = i_res + 1;
  } while( true );
}

Assistant:

void CollisionFrontend::print_broad_clash_counts(const class Structure &Conf,
    const std::vector<int> &starts,
    const std::vector<int> &ends,
    const bool b_ignore_self) const {
 
    assert(starts.size() == ends.size());   
    std::cout << "res,bbc,scc,tot,mc\n";
    
    // Structure used for detecting whether two backbone atoms are within two bonds or
    // less of each other
    struct atom_info infos[e1_3_num] = { 0 };

    // The overlap factor: If the ratio of distance between two atoms centers
    // to the sum of their atomic radii is less than this value, then the atoms
    // are colliding.
    double ofac2 = 1.0;
    
    const size_t num_loops = starts.size();

    // Total number of loop backbone atoms that clash with protein
    int total_bb_clashes = 0;
    // Total number of loop side chain atoms that clash with protein
    int total_sc_clashes = 0;
    // Total number of loop atoms that clash with membrane
    int total_memb_clashes = 0;

    for (size_t i_loop = 0; i_loop < num_loops; ++i_loop) {
        for (size_t i_res = starts[i_loop]; i_res <= ends[i_loop]; ++i_res) {
            const Residue &res = Conf._res[i_res];
            assert(res._posn == i_res);

            // Total number of backbone atoms at this residue that clash with protein
            int bb_clashes = 0;
            // Total number of side chain atoms at this residue that clash with protein
            int sc_clashes = 0;
            // Total number of atoms at this residue that clash with membrane
            int memb_clashes = 0;

            for (short i_atom = 0; i_atom < res._numAtom; ++i_atom) {
                // Obtain handle to atom
                const Atom &atom = res._atom[i_atom];
                if (VdwUtils::should_ignore_atom(atom)) {
                    continue;
                }

                // 1-3 collision filter for backbone atoms
                const bool is_bb_atom = (i_atom < NUM_BB_ATOM);
                if (is_bb_atom) {
                    infos[e1_3_gobbo].res_ix = static_cast<int>(i_res);
                    assert(infos[e1_3_gobbo].res_ix >= 1);
                    assert(infos[e1_3_gobbo].res_ix <= Conf._numRes);
                    infos[e1_3_gobbo].atom_ix = i_atom;
                    infos[e1_3_gobbo].res_type = Conf._res[infos[e1_3_gobbo].res_ix]._type;
                }

                // Check against membrane
                if (m_membrane.collides(atom, m_ofac2[eIxOFAC_memb])) {
                    ++memb_clashes;
                }

                // Broad phase
                collision_grid_prot::filter_results_t nearby_atoms;
                m_broad_phase.filter(nearby_atoms,
                                     atom.x, atom.y, atom.z,
                                     collision_grid_prot::elem_radius(atom));

                // Narrow phase
                const size_t num_nearby_atoms = nearby_atoms.size();
                for (size_t i_nearby_atom = 0; i_nearby_atom < num_nearby_atoms; ++i_nearby_atom) {
                    const collision_grid_prot::atom_key &nearby_atom_key = nearby_atoms[i_nearby_atom];
                    assert(nearby_atom_key.res_ix >= 1);
                    assert(nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes));
                    assert(nearby_atom_key.atom_ix >= 0);
                    assert(nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom));
                    const Atom &nearby_atom = Conf._res[nearby_atom_key.res_ix]._atom[nearby_atom_key.atom_ix];
                    assert(!VdwUtils::should_ignore_atom(nearby_atom));

                    // Skip self residues
                    if (b_ignore_self && (nearby_atom_key.res_ix == i_res)) {
                        continue;
                    }

                    // Skip if 1-3 connected (connected within at most 2 bonds)
                    // only supported if first atom is backbone atom
                    if (is_bb_atom)
                    {
                        infos[e1_3_alt].res_ix = nearby_atom_key.res_ix;
                        infos[e1_3_alt].atom_ix = nearby_atom_key.atom_ix;
                        infos[e1_3_alt].res_type = Conf._res[nearby_atom_key.res_ix]._type;
                        if (gobbo_are_1_3_connected(infos)) {
                            continue;
                        }

                        // HACK: Ca+1 and carbonyl O always seem to clash,
                        // even in native structure so ignore that specific interaction
                        if (hack_ignore_Ca1_with_O_clash(infos)) {
                            continue;
                        }
                    }

                    // Check for overlap
                    ofac2 = get_ofac2(static_cast<int>(i_res), static_cast<int>(nearby_atom_key.res_ix));
                    if (atoms_overlap(atom, nearby_atom, ofac2)) {
                        if (is_bb_atom) {
                            ++bb_clashes;
                        }
                        else {
                            ++sc_clashes;
                        }
                        // Check next atom for clashes
                        break;
                    }
                } // end narrow phase check

            } // end iteration over atoms

            std::cout << res.get_name_3() << ":" << i_res << ","
                      << bb_clashes << ","
                      << sc_clashes << ","
                      << bb_clashes + sc_clashes << ","
                      << memb_clashes << std::endl;

            total_bb_clashes += bb_clashes;
            total_sc_clashes += sc_clashes;
            total_memb_clashes += memb_clashes;

        } // end iteration over residues
    } // end iteration over loops

    std::cout << "TOTAL BB CLASHES: " << total_bb_clashes << std::endl;
    std::cout << "TOTAL SC CLASHES: " << total_sc_clashes << std::endl;
    std::cout << "TOTAL MEMB CLASHES: " << total_memb_clashes << std::endl;
}